

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

void __thiscall DiceRoller::~DiceRoller(DiceRoller *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  DiceRoller *this_local;
  
  if (this->diceRolled != (int *)0x0) {
    operator_delete(this->diceRolled,4);
  }
  this_00 = this->history;
  if (this_00 != (vector<int,_std::allocator<int>_> *)0x0) {
    std::vector<int,_std::allocator<int>_>::~vector(this_00);
    operator_delete(this_00,0x18);
  }
  return;
}

Assistant:

DiceRoller::~DiceRoller() {
    delete diceRolled;
    delete history;
}